

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err_test.cc
# Opt level: O0

void __thiscall ErrTest_SaveAndRestore_Test::TestBody(ErrTest_SaveAndRestore_Test *this)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  ERR_SAVE_STATE *pEVar4;
  pointer peVar5;
  char *in_R9;
  AssertHelper local_538;
  Message local_530;
  uint local_528 [2];
  undefined1 local_520 [8];
  AssertionResult gtest_ar_30;
  Message local_508;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_29;
  Message local_4e8;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_28;
  Message local_4c8;
  int local_4bc;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_27;
  Message local_4a0;
  int local_494;
  undefined1 local_490 [8];
  AssertionResult gtest_ar_26;
  ScopedTrace gtest_trace_223;
  int j;
  uint uStack_470;
  ScopedTrace gtest_trace_220;
  int i_3;
  uint i_2;
  uint i_1;
  Message local_460;
  uint local_458 [2];
  undefined1 local_450 [8];
  AssertionResult gtest_ar_25;
  Message local_438;
  int local_42c;
  undefined1 local_428 [8];
  AssertionResult gtest_ar_24;
  Message local_410;
  undefined1 local_408 [8];
  AssertionResult gtest_ar_23;
  Message local_3f0;
  int local_3e4;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_22;
  Message local_3c8;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_21;
  Message local_3a8;
  int local_3a0;
  int local_39c;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_20;
  Message local_380;
  int local_378;
  int local_374;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_19;
  Message local_358;
  int local_34c;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_18;
  Message local_330;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_17;
  Message local_310;
  int local_304;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_16;
  Message local_2e8;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar_15;
  Message local_2c8;
  int local_2c0;
  int local_2bc;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_14;
  Message local_2a0;
  int local_298;
  int local_294;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_13;
  Message local_278;
  int local_26c;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_12;
  Message local_250;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_11;
  Message local_230;
  int local_224;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_10;
  Message local_208;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_9;
  Message local_1e8;
  int local_1e0;
  int local_1dc;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_8;
  Message local_1c0;
  int local_1b8;
  int local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_7;
  ScopedTrace gtest_trace_174;
  uint i;
  Message local_190;
  int local_184;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_6;
  Message local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_5;
  Message local_148;
  int local_13c;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_4;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_3;
  Message local_100;
  int local_f8;
  int local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_2;
  Message local_d8;
  int local_d0;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  char *pcStack_b0;
  uint32_t packed_error;
  char *data;
  char *file;
  int local_98;
  int flags;
  int line;
  AssertHelper local_70;
  Message local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_;
  UniquePtr<ERR_SAVE_STATE> saved;
  Message local_40 [3];
  uint local_28 [2];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  ErrTest_SaveAndRestore_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  ERR_put_error(1,0,1,"test1.c",1);
  ERR_put_error(2,0,2,"test2.c",2);
  ERR_add_error_data(1,"data1");
  ERR_restore_state((ERR_SAVE_STATE *)0x0);
  local_28[1] = 0;
  uVar2 = ERR_get_error();
  local_28[0] = (uint)uVar2;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_20,"0u","ERR_get_error()",local_28 + 1,local_28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&saved,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
               ,0x96,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&saved,local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&saved);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  ERR_put_error(1,0,1,"test1.c",1);
  ERR_add_error_data(1,"data1");
  ERR_put_error(2,0,2,"test2.c",2);
  ERR_put_error(3,0,3,"test3.c",3);
  ERR_add_error_data(1,"data3");
  pEVar4 = ERR_save_state();
  std::unique_ptr<err_save_state_st,bssl::internal::Deleter>::
  unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<err_save_state_st,bssl::internal::Deleter> *)&gtest_ar_.message_,pEVar4);
  testing::AssertionResult::
  AssertionResult<std::unique_ptr<err_save_state_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_60,
             (unique_ptr<err_save_state_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,
             (type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&line,(internal *)local_60,(AssertionResult *)"saved","false","true",in_R9)
    ;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
               ,0x9f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    std::__cxx11::string::~string((string *)&line);
    testing::Message::~Message(&local_68);
  }
  flags = (int)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  if (flags == 0) {
    uVar2 = ERR_get_error_line_data
                      (&data,&local_98,&stack0xffffffffffffff50,(int *)((long)&file + 4));
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = (uint32_t)uVar2;
    local_cc = ERR_GET_LIB(gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_);
    local_d0 = 1;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_c8,"ERR_GET_LIB(packed_error)","1",&local_cc,&local_d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
    if (!bVar1) {
      testing::Message::Message(&local_d8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                 ,0xa5,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
    local_f4 = ERR_GET_REASON(gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_);
    local_f8 = 1;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_f0,"ERR_GET_REASON(packed_error)","1",&local_f4,&local_f8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
    if (!bVar1) {
      testing::Message::Message(&local_100);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                 ,0xa6,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_100);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_100);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
    testing::internal::CmpHelperSTREQ((internal *)local_118,"\"test1.c\"","file","test1.c",data);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
    if (!bVar1) {
      testing::Message::Message(&local_120);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                 ,0xa7,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_120);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
    local_13c = 1;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_138,"line","1",&local_98,&local_13c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
    if (!bVar1) {
      testing::Message::Message(&local_148);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                 ,0xa8,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_148);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_148);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
    testing::internal::CmpHelperSTREQ((internal *)local_160,"data","\"data1\"",pcStack_b0,"data1");
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
    if (!bVar1) {
      testing::Message::Message(&local_168);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                 ,0xa9,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_168);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_168);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
    local_184 = 3;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_180,"flags","1 | 2",(int *)((long)&file + 4),&local_184);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
    if (!bVar1) {
      testing::Message::Message(&local_190);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffe68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                 ,0xaa,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffe68,&local_190);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe68);
      testing::Message::~Message(&local_190);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
    for (gtest_ar_7.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl._4_4_ = 0;
        gtest_ar_7.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ < 2;
        gtest_ar_7.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ =
             gtest_ar_7.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._4_4_ + 1) {
      testing::ScopedTrace::ScopedTrace<unsigned_int>
                ((ScopedTrace *)
                 ((long)&gtest_ar_7.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 + 3),
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                 ,0xae,(uint *)((long)&gtest_ar_7.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               + 4));
      peVar5 = std::unique_ptr<err_save_state_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<err_save_state_st,_bssl::internal::Deleter> *)
                          &gtest_ar_.message_);
      ERR_restore_state(peVar5);
      uVar2 = ERR_get_error_line_data
                        (&data,&local_98,&stack0xffffffffffffff50,(int *)((long)&file + 4));
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = (uint32_t)uVar2;
      local_1b4 = ERR_GET_LIB(gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_);
      local_1b8 = 1;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_1b0,"ERR_GET_LIB(packed_error)","1",&local_1b4,&local_1b8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
      if (!bVar1) {
        testing::Message::Message(&local_1c0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xb2,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_1c0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
        testing::Message::~Message(&local_1c0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
      local_1dc = ERR_GET_REASON(gtest_ar_1.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._4_4_);
      local_1e0 = 1;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_1d8,"ERR_GET_REASON(packed_error)","1",&local_1dc,&local_1e0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
      if (!bVar1) {
        testing::Message::Message(&local_1e8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xb3,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_1e8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
        testing::Message::~Message(&local_1e8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
      testing::internal::CmpHelperSTREQ((internal *)local_200,"\"test1.c\"","file","test1.c",data);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
      if (!bVar1) {
        testing::Message::Message(&local_208);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xb4,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_208)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
        testing::Message::~Message(&local_208);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
      local_224 = 1;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_220,"line","1",&local_98,&local_224);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
      if (!bVar1) {
        testing::Message::Message(&local_230);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xb5,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_230)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
        testing::Message::~Message(&local_230);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
      testing::internal::CmpHelperSTREQ((internal *)local_248,"data","\"data1\"",pcStack_b0,"data1")
      ;
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
      if (!bVar1) {
        testing::Message::Message(&local_250);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xb6,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_250)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
        testing::Message::~Message(&local_250);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
      local_26c = 3;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_268,"flags","1 | 2",(int *)((long)&file + 4),&local_26c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
      if (!bVar1) {
        testing::Message::Message(&local_278);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xb7,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_278)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
        testing::Message::~Message(&local_278);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
      uVar2 = ERR_get_error_line_data
                        (&data,&local_98,&stack0xffffffffffffff50,(int *)((long)&file + 4));
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = (uint32_t)uVar2;
      local_294 = ERR_GET_LIB(gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_);
      local_298 = 2;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_290,"ERR_GET_LIB(packed_error)","2",&local_294,&local_298);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
      if (!bVar1) {
        testing::Message::Message(&local_2a0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xba,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_2a0)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
        testing::Message::~Message(&local_2a0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
      local_2bc = ERR_GET_REASON(gtest_ar_1.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._4_4_);
      local_2c0 = 2;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_2b8,"ERR_GET_REASON(packed_error)","2",&local_2bc,&local_2c0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
      if (!bVar1) {
        testing::Message::Message(&local_2c8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xbb,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_2c8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
        testing::Message::~Message(&local_2c8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
      testing::internal::CmpHelperSTREQ((internal *)local_2e0,"\"test2.c\"","file","test2.c",data);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
      if (!bVar1) {
        testing::Message::Message(&local_2e8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xbc,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_2e8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
        testing::Message::~Message(&local_2e8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
      local_304 = 2;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_300,"line","2",&local_98,&local_304);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
      if (!bVar1) {
        testing::Message::Message(&local_310);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xbd,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_310)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
        testing::Message::~Message(&local_310);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
      testing::internal::CmpHelperSTREQ((internal *)local_328,"data","\"\"",pcStack_b0,"");
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
      if (!bVar1) {
        testing::Message::Message(&local_330);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xbe,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_330)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
        testing::Message::~Message(&local_330);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
      local_34c = 0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_348,"flags","0",(int *)((long)&file + 4),&local_34c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
      if (!bVar1) {
        testing::Message::Message(&local_358);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xbf,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_358)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
        testing::Message::~Message(&local_358);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
      uVar2 = ERR_get_error_line_data
                        (&data,&local_98,&stack0xffffffffffffff50,(int *)((long)&file + 4));
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = (uint32_t)uVar2;
      local_374 = ERR_GET_LIB(gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_);
      local_378 = 3;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_370,"ERR_GET_LIB(packed_error)","3",&local_374,&local_378);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
      if (!bVar1) {
        testing::Message::Message(&local_380);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xc2,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_380)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
        testing::Message::~Message(&local_380);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
      local_39c = ERR_GET_REASON(gtest_ar_1.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._4_4_);
      local_3a0 = 3;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_398,"ERR_GET_REASON(packed_error)","3",&local_39c,&local_3a0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
      if (!bVar1) {
        testing::Message::Message(&local_3a8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xc3,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_3a8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
        testing::Message::~Message(&local_3a8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
      testing::internal::CmpHelperSTREQ((internal *)local_3c0,"\"test3.c\"","file","test3.c",data);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
      if (!bVar1) {
        testing::Message::Message(&local_3c8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xc4,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_3c8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
        testing::Message::~Message(&local_3c8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
      local_3e4 = 3;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_3e0,"line","3",&local_98,&local_3e4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
      if (!bVar1) {
        testing::Message::Message(&local_3f0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xc5,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_3f0)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
        testing::Message::~Message(&local_3f0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
      testing::internal::CmpHelperSTREQ((internal *)local_408,"data","\"data3\"",pcStack_b0,"data3")
      ;
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
      if (!bVar1) {
        testing::Message::Message(&local_410);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xc6,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_410)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
        testing::Message::~Message(&local_410);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
      local_42c = 3;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_428,"flags","1 | 2",(int *)((long)&file + 4),&local_42c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
      if (!bVar1) {
        testing::Message::Message(&local_438);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,199,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_438)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
        testing::Message::~Message(&local_438);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
      local_458[1] = 0;
      uVar2 = ERR_get_error();
      local_458[0] = (uint)uVar2;
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                ((EqHelper *)local_450,"0u","ERR_get_error()",local_458 + 1,local_458);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
      if (!bVar1) {
        testing::Message::Message(&local_460);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_450);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&i_2,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xca,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&i_2,&local_460);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_2);
        testing::Message::~Message(&local_460);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
      testing::ScopedTrace::~ScopedTrace
                ((ScopedTrace *)
                 ((long)&gtest_ar_7.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 + 3));
    }
    ERR_clear_error();
    for (i_3 = 0; (uint)i_3 < 8; i_3 = i_3 + 1) {
      ERR_put_error(0,0,0,"invalid",0);
    }
    for (uStack_470 = 1; uStack_470 < 0x10; uStack_470 = uStack_470 + 1) {
      ERR_put_error(uStack_470,0,uStack_470,"test",uStack_470);
    }
    pEVar4 = ERR_save_state();
    std::unique_ptr<err_save_state_st,_bssl::internal::Deleter>::reset
              ((unique_ptr<err_save_state_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,pEVar4)
    ;
    ERR_get_error();
    for (j = 0; j < 2; j = j + 1) {
      testing::ScopedTrace::ScopedTrace<int>
                (&gtest_trace_223,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                 ,0xdc,&j);
      peVar5 = std::unique_ptr<err_save_state_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<err_save_state_st,_bssl::internal::Deleter> *)
                          &gtest_ar_.message_);
      ERR_restore_state(peVar5);
      for (gtest_ar_26.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl._4_4_ = 1;
          gtest_ar_26.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ < 0x10;
          gtest_ar_26.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ =
               gtest_ar_26.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._4_4_ + 1) {
        testing::ScopedTrace::ScopedTrace<int>
                  ((ScopedTrace *)
                   ((long)&gtest_ar_26.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   + 3),
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xdf,(int *)((long)&gtest_ar_26.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                + 4));
        uVar2 = ERR_get_error_line_data
                          (&data,&local_98,&stack0xffffffffffffff50,(int *)((long)&file + 4));
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = (uint32_t)uVar2;
        local_494 = ERR_GET_LIB(gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_490,"ERR_GET_LIB(packed_error)","j",&local_494,
                   (int *)((long)&gtest_ar_26.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          + 4));
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
        if (!bVar1) {
          testing::Message::Message(&local_4a0);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                     ,0xe1,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_27.message_,&local_4a0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
          testing::Message::~Message(&local_4a0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
        local_4bc = ERR_GET_REASON(gtest_ar_1.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_4b8,"ERR_GET_REASON(packed_error)","j",&local_4bc,
                   (int *)((long)&gtest_ar_26.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          + 4));
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
        if (!bVar1) {
          testing::Message::Message(&local_4c8);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                     ,0xe2,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_28.message_,&local_4c8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
          testing::Message::~Message(&local_4c8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
        testing::internal::CmpHelperSTREQ((internal *)local_4e0,"\"test\"","file","test",data);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
        if (!bVar1) {
          testing::Message::Message(&local_4e8);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                     ,0xe3,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_29.message_,&local_4e8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
          testing::Message::~Message(&local_4e8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_500,"line","j",&local_98,
                   (int *)((long)&gtest_ar_26.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          + 4));
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
        if (!bVar1) {
          testing::Message::Message(&local_508);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                     ,0xe4,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_30.message_,&local_508);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
          testing::Message::~Message(&local_508);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
        testing::ScopedTrace::~ScopedTrace
                  ((ScopedTrace *)
                   ((long)&gtest_ar_26.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   + 3));
      }
      local_528[1] = 0;
      uVar2 = ERR_get_error();
      local_528[0] = (uint)uVar2;
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                ((EqHelper *)local_520,"0u","ERR_get_error()",local_528 + 1,local_528);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
      if (!bVar1) {
        testing::Message::Message(&local_530);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_520);
        testing::internal::AssertHelper::AssertHelper
                  (&local_538,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xe7,pcVar3);
        testing::internal::AssertHelper::operator=(&local_538,&local_530);
        testing::internal::AssertHelper::~AssertHelper(&local_538);
        testing::Message::~Message(&local_530);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
      testing::ScopedTrace::~ScopedTrace(&gtest_trace_223);
    }
    flags = 0;
  }
  std::unique_ptr<err_save_state_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<err_save_state_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(ErrTest, SaveAndRestore) {
  // Restoring no state clears the error queue, including error data.
  ERR_put_error(1, 0 /* unused */, 1, "test1.c", 1);
  ERR_put_error(2, 0 /* unused */, 2, "test2.c", 2);
  ERR_add_error_data(1, "data1");
  ERR_restore_state(nullptr);
  EXPECT_EQ(0u, ERR_get_error());

  // Add some entries to the error queue and save it.
  ERR_put_error(1, 0 /* unused */, 1, "test1.c", 1);
  ERR_add_error_data(1, "data1");
  ERR_put_error(2, 0 /* unused */, 2, "test2.c", 2);
  ERR_put_error(3, 0 /* unused */, 3, "test3.c", 3);
  ERR_add_error_data(1, "data3");
  bssl::UniquePtr<ERR_SAVE_STATE> saved(ERR_save_state());
  ASSERT_TRUE(saved);

  // The existing error queue entries still exist.
  int line, flags;
  const char *file, *data;
  uint32_t packed_error = ERR_get_error_line_data(&file, &line, &data, &flags);
  EXPECT_EQ(ERR_GET_LIB(packed_error), 1);
  EXPECT_EQ(ERR_GET_REASON(packed_error), 1);
  EXPECT_STREQ("test1.c", file);
  EXPECT_EQ(line, 1);
  EXPECT_STREQ(data, "data1");
  EXPECT_EQ(flags, ERR_FLAG_STRING | ERR_FLAG_MALLOCED);

  // The state may be restored, both over an empty and non-empty state.
  for (unsigned i = 0; i < 2; i++) {
    SCOPED_TRACE(i);
    ERR_restore_state(saved.get());

    packed_error = ERR_get_error_line_data(&file, &line, &data, &flags);
    EXPECT_EQ(ERR_GET_LIB(packed_error), 1);
    EXPECT_EQ(ERR_GET_REASON(packed_error), 1);
    EXPECT_STREQ("test1.c", file);
    EXPECT_EQ(line, 1);
    EXPECT_STREQ(data, "data1");
    EXPECT_EQ(flags, ERR_FLAG_STRING | ERR_FLAG_MALLOCED);

    packed_error = ERR_get_error_line_data(&file, &line, &data, &flags);
    EXPECT_EQ(ERR_GET_LIB(packed_error), 2);
    EXPECT_EQ(ERR_GET_REASON(packed_error), 2);
    EXPECT_STREQ("test2.c", file);
    EXPECT_EQ(line, 2);
    EXPECT_STREQ(data, "");  // No error data is reported as the empty string.
    EXPECT_EQ(flags, 0);

    packed_error = ERR_get_error_line_data(&file, &line, &data, &flags);
    EXPECT_EQ(ERR_GET_LIB(packed_error), 3);
    EXPECT_EQ(ERR_GET_REASON(packed_error), 3);
    EXPECT_STREQ("test3.c", file);
    EXPECT_EQ(line, 3);
    EXPECT_STREQ(data, "data3");
    EXPECT_EQ(flags, ERR_FLAG_STRING | ERR_FLAG_MALLOCED);

    // The error queue is now empty for the next iteration.
    EXPECT_EQ(0u, ERR_get_error());
  }

  // Test a case where the error queue wraps around. The first set of errors
  // will all be discarded, but result in wrapping the list around.
  ERR_clear_error();
  for (unsigned i = 0; i < ERR_NUM_ERRORS / 2; i++) {
    ERR_put_error(0, 0 /* unused */, 0, "invalid", 0);
  }
  for (unsigned i = 1; i < ERR_NUM_ERRORS; i++) {
    ERR_put_error(i, 0 /* unused */, i, "test", i);
  }
  saved.reset(ERR_save_state());

  // The state may be restored, both over an empty and non-empty state. Pop one
  // error off so the first iteration is tested to not be a no-op.
  ERR_get_error();
  for (int i = 0; i < 2; i++) {
    SCOPED_TRACE(i);
    ERR_restore_state(saved.get());
    for (int j = 1; j < ERR_NUM_ERRORS; j++) {
      SCOPED_TRACE(j);
      packed_error = ERR_get_error_line_data(&file, &line, &data, &flags);
      EXPECT_EQ(ERR_GET_LIB(packed_error), j);
      EXPECT_EQ(ERR_GET_REASON(packed_error), j);
      EXPECT_STREQ("test", file);
      EXPECT_EQ(line, j);
    }
    // The error queue is now empty for the next iteration.
    EXPECT_EQ(0u, ERR_get_error());
  }
}